

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DebugInfoManager::RegisterDbgInst(DebugInfoManager *this,Instruction *inst)

{
  bool bVar1;
  Instruction *pIVar2;
  uint32_t uVar3;
  Operand *pOVar4;
  uint *puVar5;
  mapped_type *ppIVar6;
  uint32_t local_1c;
  Instruction *local_18;
  Instruction *inst_local;
  DebugInfoManager *this_local;
  
  local_18 = inst;
  inst_local = (Instruction *)this;
  uVar3 = opt::Instruction::NumInOperands(inst);
  bVar1 = false;
  if (uVar3 != 0) {
    uVar3 = GetDbgSetImportId(this);
    pOVar4 = opt::Instruction::GetInOperand(local_18,0);
    puVar5 = utils::SmallVector<unsigned_int,_2UL>::operator[](&pOVar4->words,0);
    bVar1 = false;
    if (uVar3 == *puVar5) {
      bVar1 = true;
    }
  }
  pIVar2 = local_18;
  if (!bVar1) {
    __assert_fail("inst->NumInOperands() != 0 && (GetDbgSetImportId() == inst->GetInOperand(0).words[0]) && \"Given instruction is not a debug instruction\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x67,
                  "void spvtools::opt::analysis::DebugInfoManager::RegisterDbgInst(Instruction *)");
  }
  local_1c = opt::Instruction::result_id(local_18);
  ppIVar6 = std::
            unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
            ::operator[](&this->id_to_dbg_inst_,&local_1c);
  *ppIVar6 = pIVar2;
  return;
}

Assistant:

void DebugInfoManager::RegisterDbgInst(Instruction* inst) {
  assert(inst->NumInOperands() != 0 &&
         (GetDbgSetImportId() == inst->GetInOperand(0).words[0]) &&
         "Given instruction is not a debug instruction");
  id_to_dbg_inst_[inst->result_id()] = inst;
}